

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regalloc.cpp
# Opt level: O0

Error __thiscall asmjit::RAPass::resolveCellOffsets(RAPass *this)

{
  int *piVar1;
  uint uVar2;
  long in_RDI;
  uint32_t alignment;
  uint32_t size_1;
  uint32_t stackPos;
  uint32_t offset;
  uint32_t size;
  uint32_t pos1;
  uint32_t pos2;
  uint32_t pos4;
  uint32_t pos8;
  uint32_t pos16;
  uint32_t pos32;
  uint32_t pos64;
  RACell *stackCell;
  RACell *varCell;
  char *in_stack_00000380;
  int in_stack_0000038c;
  char *in_stack_00000390;
  bool local_6a;
  int local_50;
  int local_4c;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined8 *local_20;
  
  local_20 = *(undefined8 **)(in_RDI + 0xe0);
  local_28 = *(undefined8 **)(in_RDI + 0xe8);
  local_2c = 0;
  local_30 = *(int *)(in_RDI + 0x108) * 0x40;
  local_34 = local_30 + *(int *)(in_RDI + 0x104) * 0x20;
  local_38 = local_34 + *(int *)(in_RDI + 0x100) * 0x10;
  local_3c = local_38 + *(int *)(in_RDI + 0xfc) * 8;
  local_40 = local_3c + *(int *)(in_RDI + 0xf8) * 4;
  local_44 = local_40 + *(int *)(in_RDI + 0xf4) * 2;
  for (; local_20 != (undefined8 *)0x0; local_20 = (undefined8 *)*local_20) {
    switch(*(undefined4 *)((long)local_20 + 0xc)) {
    case 1:
      local_4c = local_44;
      local_44 = local_44 + 1;
      break;
    case 2:
      local_4c = local_40;
      local_40 = local_40 + 2;
      break;
    default:
      DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
    case 4:
      local_4c = local_3c;
      local_3c = local_3c + 4;
      break;
    case 8:
      local_4c = local_38;
      local_38 = local_38 + 8;
      break;
    case 0x10:
      local_4c = local_34;
      local_34 = local_34 + 0x10;
      break;
    case 0x20:
      local_4c = local_30;
      local_30 = local_30 + 0x20;
      break;
    case 0x40:
      local_4c = local_2c;
      local_2c = local_2c + 0x40;
    }
    *(int *)(local_20 + 1) = local_4c;
  }
  local_50 = local_44 + *(int *)(in_RDI + 0xf0);
  while( true ) {
    if (local_28 == (undefined8 *)0x0) {
      *(int *)(in_RDI + 0x11c) = local_50;
      return 0;
    }
    piVar1 = (int *)((long)local_28 + 0xc);
    uVar2 = *(uint *)(local_28 + 2);
    local_6a = false;
    if (uVar2 != 0) {
      local_6a = uVar2 != 0 && (uVar2 & uVar2 - 1) == 0;
    }
    if (!local_6a) break;
    uVar2 = local_50 + (uVar2 - 1) & (uVar2 - 1 ^ 0xffffffff);
    *(uint *)(local_28 + 1) = uVar2;
    local_28 = (undefined8 *)*local_28;
    local_50 = *piVar1 + uVar2;
  }
  DebugUtils::assertionFailed(in_stack_00000390,in_stack_0000038c,in_stack_00000380);
}

Assistant:

Error RAPass::resolveCellOffsets() {
  RACell* varCell = _memVarCells;
  RACell* stackCell = _memStackCells;

  uint32_t pos64 = 0;
  uint32_t pos32 = pos64 + _mem64ByteVarsUsed * 64;
  uint32_t pos16 = pos32 + _mem32ByteVarsUsed * 32;
  uint32_t pos8  = pos16 + _mem16ByteVarsUsed * 16;
  uint32_t pos4  = pos8  + _mem8ByteVarsUsed  * 8 ;
  uint32_t pos2  = pos4  + _mem4ByteVarsUsed  * 4 ;
  uint32_t pos1  = pos2  + _mem2ByteVarsUsed  * 2 ;

  // Assign home slots.
  while (varCell) {
    uint32_t size = varCell->size;
    uint32_t offset = 0;

    switch (size) {
      case  1: offset = pos1 ; pos1  += 1 ; break;
      case  2: offset = pos2 ; pos2  += 2 ; break;
      case  4: offset = pos4 ; pos4  += 4 ; break;
      case  8: offset = pos8 ; pos8  += 8 ; break;
      case 16: offset = pos16; pos16 += 16; break;
      case 32: offset = pos32; pos32 += 32; break;
      case 64: offset = pos64; pos64 += 64; break;

      default:
        ASMJIT_NOT_REACHED();
    }

    varCell->offset = static_cast<int32_t>(offset);
    varCell = varCell->next;
  }

  // Assign stack slots.
  uint32_t stackPos = pos1 + _mem1ByteVarsUsed;
  while (stackCell) {
    uint32_t size = stackCell->size;
    uint32_t alignment = stackCell->alignment;
    ASMJIT_ASSERT(alignment != 0 && Utils::isPowerOf2(alignment));

    stackPos = Utils::alignTo(stackPos, alignment);
    stackCell->offset = stackPos;
    stackCell = stackCell->next;

    stackPos += size;
  }

  _memAllTotal = stackPos;
  return kErrorOk;
}